

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_muladd_ppc(float16 a,float16 b,float16 c,int flags,float_status *status)

{
  byte bVar1;
  _Bool _Var2;
  float16 fVar3;
  FloatParts FVar4;
  FloatParts FVar5;
  FloatParts FVar6;
  FloatParts pr;
  FloatParts pc;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  int flags_local;
  float16 c_local;
  float16 b_local;
  float16 a_local;
  uint64_t local_108;
  uint64_t local_e8;
  ulong local_c8;
  int local_9c;
  ulong uStack_98;
  int shift;
  uint64_t c_lo_1;
  uint64_t c_hi_1;
  uint64_t c_lo;
  uint64_t c_hi;
  int exp_diff;
  int p_exp;
  uint64_t lo;
  uint64_t hi;
  FloatClass p_class;
  _Bool sign_flip;
  _Bool p_sign;
  float_status *pfStack_58;
  _Bool inf_zero;
  uint local_4c;
  uint64_t local_48;
  int local_40;
  FloatClass FStack_3c;
  _Bool _Stack_3b;
  undefined2 uStack_3a;
  uint64_t local_38;
  int32_t local_30;
  FloatClass FStack_2c;
  _Bool _Stack_2b;
  undefined2 uStack_2a;
  ulong local_28;
  int local_20;
  FloatClass FStack_1c;
  _Bool _Stack_1b;
  undefined2 uStack_1a;
  FloatParts local_18;
  
  FVar4 = float16a_unpack_canonical(a,status,&float16_params);
  local_c8 = FVar4.frac;
  FVar5 = float16a_unpack_canonical(b,status,&float16_params);
  local_e8 = FVar5.frac;
  FVar6 = float16a_unpack_canonical(c,status,&float16_params);
  local_108 = FVar6.frac;
  local_28 = local_c8;
  local_20 = FVar4.exp;
  FStack_1c = FVar4.cls;
  _Stack_1b = FVar4.sign;
  uStack_1a = FVar4._14_2_;
  local_38 = local_e8;
  local_30 = FVar5.exp;
  FStack_2c = FVar5.cls;
  _Stack_2b = FVar5.sign;
  uStack_2a = FVar5._14_2_;
  local_48 = local_108;
  local_40 = FVar6.exp;
  FStack_3c = FVar6.cls;
  _Stack_3b = FVar6.sign;
  uStack_3a = FVar6._14_2_;
  hi._7_1_ = (1 << (FStack_1c & 0x1f) | 1 << (FStack_2c & 0x1f)) == 10;
  hi._5_1_ = (flags & 4U) != 0;
  pfStack_58 = status;
  local_4c = flags;
  _Var2 = is_nan(FStack_1c);
  if (((_Var2) || (_Var2 = is_nan(FStack_2c), _Var2)) || (_Var2 = is_nan(FStack_3c), _Var2)) {
    FVar6.exp = local_20;
    FVar6.frac = local_28;
    FVar6.cls = FStack_1c;
    FVar6.sign = _Stack_1b;
    FVar6._14_2_ = uStack_1a;
    FVar5.exp = local_30;
    FVar5.frac = local_38;
    FVar5.cls = FStack_2c;
    FVar5.sign = _Stack_2b;
    FVar5._14_2_ = uStack_2a;
    FVar4.exp = local_40;
    FVar4.frac = local_48;
    FVar4.cls = FStack_3c;
    FVar4.sign = _Stack_3b;
    FVar4._14_2_ = uStack_3a;
    local_18 = pick_nan_muladd(FVar6,FVar5,FVar4,(_Bool)(hi._7_1_ & 1),pfStack_58);
  }
  else if ((hi._7_1_ & 1) == 0) {
    if ((local_4c & 1) != 0) {
      _Stack_3b = (_Stack_3b & 1U) != 1;
    }
    hi._6_1_ = (_Stack_1b & 1U) != (_Stack_2b & 1U);
    if ((local_4c & 2) != 0) {
      hi._6_1_ = !(bool)hi._6_1_;
    }
    if ((FStack_1c == float_class_inf) || (FStack_2c == float_class_inf)) {
      hi._4_1_ = '\x03';
    }
    else if ((FStack_1c == float_class_zero) || (FStack_2c == float_class_zero)) {
      hi._4_1_ = '\x01';
    }
    else {
      hi._4_1_ = '\x02';
    }
    if (FStack_3c == float_class_inf) {
      if ((hi._4_1_ == '\x03') && (hi._6_1_ != (_Stack_3b & 1U))) {
        pfStack_58->float_exception_flags = pfStack_58->float_exception_flags | 1;
        local_18 = parts_default_nan(pfStack_58);
      }
      else {
        FStack_1c = float_class_inf;
        _Stack_1b = (_Stack_3b & 1U) != (hi._5_1_ & 1);
        local_18.cls = 3;
        local_18.exp = local_20;
        local_18.sign = _Stack_1b;
        local_18._14_2_ = uStack_1a;
        local_18.frac = local_28;
      }
    }
    else if (hi._4_1_ == '\x03') {
      FStack_1c = float_class_inf;
      _Stack_1b = hi._6_1_ != (hi._5_1_ & 1);
      local_18.cls = 3;
      local_18.exp = local_20;
      local_18.sign = _Stack_1b;
      local_18._14_2_ = uStack_1a;
      local_18.frac = local_28;
    }
    else if (hi._4_1_ == '\x01') {
      if (FStack_3c == float_class_zero) {
        if (hi._6_1_ != (_Stack_3b & 1U)) {
          hi._6_1_ = pfStack_58->float_rounding_mode == '\x01';
        }
        _Stack_3b = (_Bool)hi._6_1_;
      }
      else if ((local_4c & 8) != 0) {
        local_40 = local_40 + -1;
      }
      _Stack_3b = (_Stack_3b & 1U) != (hi._5_1_ & 1);
      local_18.cls = FStack_3c;
      local_18.exp = local_40;
      local_18.sign = _Stack_3b;
      local_18._14_2_ = uStack_3a;
      local_18.frac = local_48;
    }
    else {
      if ((FStack_1c != float_class_normal) || (FStack_2c != float_class_normal)) {
        __assert_fail("a.cls == float_class_normal && b.cls == float_class_normal",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                      ,0x58e,
                      "FloatParts muladd_floats(FloatParts, FloatParts, FloatParts, int, float_status *)"
                     );
      }
      c_hi._4_4_ = local_20 + local_30;
      mul64To128(local_28,local_38,&lo,(uint64_t *)&exp_diff);
      if ((lo & 0x2000000000000000) != 0) {
        shift128RightJamming(lo,_exp_diff,1,&lo,(uint64_t *)&exp_diff);
        c_hi._4_4_ = c_hi._4_4_ + 1;
      }
      if (FStack_3c == float_class_zero) {
        shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
      }
      else {
        c_hi._0_4_ = c_hi._4_4_ - local_40;
        if ((hi._6_1_ & 1) == (_Stack_3b & 1U)) {
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,0x3e - (int)c_hi,&lo,(uint64_t *)&exp_diff);
            _exp_diff = local_48 + _exp_diff;
            c_hi._4_4_ = local_40;
          }
          else {
            c_lo = local_48 >> 2;
            c_hi_1 = 0;
            shift128RightJamming(c_lo,0,(int)c_hi,&c_lo,&c_hi_1);
            add128(lo,_exp_diff,c_lo,c_hi_1,&lo,(uint64_t *)&exp_diff);
            shift128RightJamming(lo,_exp_diff,0x3e,&lo,(uint64_t *)&exp_diff);
          }
          if ((_exp_diff & 0x8000000000000000) != 0) {
            shift64RightJamming(_exp_diff,1,(uint64_t *)&exp_diff);
            c_hi._4_4_ = c_hi._4_4_ + 1;
          }
        }
        else {
          c_lo_1 = local_48 >> 2;
          uStack_98 = 0;
          if ((int)c_hi < 1) {
            shift128RightJamming(lo,_exp_diff,-(int)c_hi,&lo,(uint64_t *)&exp_diff);
            if (((int)c_hi == 0) && ((c_lo_1 < lo || ((lo == c_lo_1 && (uStack_98 <= _exp_diff))))))
            {
              sub128(lo,_exp_diff,c_lo_1,uStack_98,&lo,(uint64_t *)&exp_diff);
            }
            else {
              sub128(c_lo_1,uStack_98,lo,_exp_diff,&lo,(uint64_t *)&exp_diff);
              hi._6_1_ = (hi._6_1_ & 1) != 1;
              c_hi._4_4_ = local_40;
            }
          }
          else {
            shift128RightJamming(c_lo_1,0,(int)c_hi,&c_lo_1,&stack0xffffffffffffff68);
            sub128(lo,_exp_diff,c_lo_1,uStack_98,&lo,(uint64_t *)&exp_diff);
          }
          if ((lo == 0) && (_exp_diff == 0)) {
            FStack_1c = float_class_zero;
            _Stack_1b = (pfStack_58->float_rounding_mode == '\x01') != (bool)(hi._5_1_ & 1);
            local_18.cls = 1;
            local_18.exp = local_20;
            local_18.sign = _Stack_1b;
            local_18._14_2_ = uStack_1a;
            local_18.frac = local_28;
            goto LAB_00e96709;
          }
          if (lo == 0) {
            local_9c = clz64(_exp_diff);
            local_9c = local_9c + 0x40;
          }
          else {
            local_9c = clz64(lo);
          }
          bVar1 = (byte)(local_9c + -1);
          if (local_9c + -1 < 0x40) {
            lo = lo << (bVar1 & 0x3f) | _exp_diff >> (0x40 - bVar1 & 0x3f);
            _exp_diff = lo | (long)(int)(uint)(_exp_diff << (bVar1 & 0x3f) != 0);
          }
          else {
            _exp_diff = _exp_diff << (bVar1 - 0x40 & 0x3f);
          }
          c_hi._4_4_ = c_hi._4_4_ - (local_9c + -3);
        }
      }
      if ((local_4c & 8) != 0) {
        c_hi._4_4_ = c_hi._4_4_ + -1;
      }
      FStack_1c = float_class_normal;
      _Stack_1b = (hi._6_1_ & 1) != (hi._5_1_ & 1);
      local_20 = c_hi._4_4_;
      local_28 = _exp_diff;
      local_18.cls = 2;
      local_18.exp = c_hi._4_4_;
      local_18.sign = _Stack_1b;
      local_18._14_2_ = uStack_1a;
      local_18.frac = _exp_diff;
    }
  }
  else {
    pfStack_58->float_exception_flags = pfStack_58->float_exception_flags | 1;
    local_18 = parts_default_nan(pfStack_58);
  }
LAB_00e96709:
  fVar3 = float16a_round_pack_canonical(local_18,status,&float16_params);
  return fVar3;
}

Assistant:

float16 QEMU_FLATTEN float16_muladd(float16 a, float16 b, float16 c,
                                                int flags, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pc = float16_unpack_canonical(c, status);
    FloatParts pr = muladd_floats(pa, pb, pc, flags, status);

    return float16_round_pack_canonical(pr, status);
}